

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O0

void Abc_NtkOrderFaninsById(Abc_Ntk_t *pNtk)

{
  char *pSop_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Str_t *p_00;
  Abc_Obj_t *pObj;
  int *pArray;
  char *__dest;
  int *pOrder;
  int local_50;
  int v;
  int i;
  int nVars;
  char *pCubeNew;
  char *pCube;
  char *pSopNew;
  char *pSop;
  Abc_Obj_t *pNode;
  Vec_Str_t *vStore;
  Vec_Int_t *vOrder;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkHasSop(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                  ,0x36,"void Abc_NtkOrderFaninsById(Abc_Ntk_t *)");
  }
  p = Vec_IntAlloc(100);
  p_00 = Vec_StrAlloc(100);
  local_50 = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_50) {
      Vec_IntFree(p);
      Vec_StrFree(p_00);
      return;
    }
    pObj = Abc_NtkObj(pNtk,local_50);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) {
      pSop_00 = (char *)(pObj->field_5).pData;
      iVar1 = Abc_SopGetVarNum(pSop_00);
      iVar2 = Abc_ObjFaninNum(pObj);
      if (iVar1 != iVar2) {
        __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                      ,0x3d,"void Abc_NtkOrderFaninsById(Abc_Ntk_t *)");
      }
      Vec_IntClear(p);
      for (pOrder._4_4_ = 0; pOrder._4_4_ < iVar1; pOrder._4_4_ = pOrder._4_4_ + 1) {
        Vec_IntPush(p,pOrder._4_4_);
      }
      pArray = Vec_IntArray(p);
      Vec_IntSelectSortCost(pArray,iVar1,&pObj->vFanins);
      iVar2 = Abc_SopGetCubeNum(pSop_00);
      Vec_StrGrow(p_00,iVar2 * (iVar1 + 3) + 1);
      __dest = Vec_StrArray(p_00);
      iVar2 = Abc_SopGetCubeNum(pSop_00);
      memcpy(__dest,pSop_00,(long)(iVar2 * (iVar1 + 3) + 1));
      pCubeNew = Vec_StrArray(p_00);
      _i = pSop_00;
      for (; *pCubeNew != '\0'; pCubeNew = pCubeNew + (iVar1 + 3)) {
        for (pOrder._4_4_ = 0; pOrder._4_4_ < iVar1; pOrder._4_4_ = pOrder._4_4_ + 1) {
          _i[pOrder._4_4_] = '-';
        }
        for (pOrder._4_4_ = 0; pOrder._4_4_ < iVar1; pOrder._4_4_ = pOrder._4_4_ + 1) {
          if (pCubeNew[pArray[pOrder._4_4_]] == '0') {
            _i[pOrder._4_4_] = '0';
          }
          else if (pCubeNew[pArray[pOrder._4_4_]] == '1') {
            _i[pOrder._4_4_] = '1';
          }
        }
        _i = _i + (iVar1 + 3);
      }
      (pObj->field_5).pData = pSop_00;
      Vec_IntSort(&pObj->vFanins,0);
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Reorder fanins of the network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkOrderFaninsById( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vOrder;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    char * pSop, * pSopNew;
    char * pCube, * pCubeNew;
    int nVars, i, v, * pOrder;
    assert( Abc_NtkHasSop(pNtk) );
    vOrder = Vec_IntAlloc( 100 );
    vStore = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
        Vec_IntClear( vOrder );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vOrder, v );
        pOrder = Vec_IntArray(vOrder);
        Vec_IntSelectSortCost( pOrder, nVars, &pNode->vFanins );
        // copy the cover
        Vec_StrGrow( vStore, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        memcpy( Vec_StrArray(vStore), pSop, (size_t)(Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1) );
        pSopNew = pCubeNew = pSop;
        pSop = Vec_StrArray(vStore);
        // generate permuted one
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                pCubeNew[v] = '-';
            for ( v = 0; v < nVars; v++ )
                if ( pCube[pOrder[v]] == '0' )
                    pCubeNew[v] = '0';
                else if ( pCube[pOrder[v]] == '1' )
                    pCubeNew[v] = '1';
            pCubeNew += nVars + 3;
        }
        pNode->pData = pSopNew;
        Vec_IntSort( &pNode->vFanins, 0 );
//        Vec_IntPrint( vOrder );
    }
    Vec_IntFree( vOrder );
    Vec_StrFree( vStore );
}